

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall immutable::vector<char,_true,_5>::vector(vector<char,_true,_5> *this)

{
  vector<char,_true,_5> *this_local;
  
  rrb_create<char,true,5>();
  return;
}

Assistant:

vector() = default;